

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinit.c
# Opt level: O3

int X_FatalErrorHandler(Display *display)

{
  return 0;
}

Assistant:

int X_FatalErrorHandler(Display *display)
{
  /* when the fatal error handler gets called it can do cleanup
   * and either exit, or return.  If it returns, the
   * FatalErrorExitHandler will be called
   */
  /* If we could do a SAVEVM in the interrupt context we would mark it
   * as needed here.  Returning will cause the FatalErrorExitHandler
   * hook to be called.
   */
  return 0;
}